

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::WriteMessageDocComment
          (java *this,Printer *printer,Descriptor *message,Options *options,bool kdoc)

{
  Options *printer_00;
  Descriptor *pDVar1;
  Options *options_00;
  string_view sVar2;
  string_view input;
  java *local_118;
  char *local_110;
  string local_108;
  string_view local_e8;
  string_view local_d8;
  string local_c8;
  string_view local_a8 [2];
  undefined1 local_88 [80];
  string_view local_38;
  byte local_21;
  Descriptor *pDStack_20;
  bool kdoc_local;
  Options *options_local;
  Descriptor *message_local;
  Printer *printer_local;
  
  local_21 = (byte)options & 1;
  pDStack_20 = message;
  options_local = (Options *)printer;
  message_local = (Descriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"/**\n");
  io::Printer::Print<>((Printer *)this,local_38);
  pDVar1 = message_local;
  printer_00 = options_local;
  Options::Options((Options *)local_88,(Options *)message);
  options_00 = (Options *)(ulong)(local_21 & 1);
  WriteDocCommentBody<google::protobuf::Descriptor>
            ((java *)pDVar1,(Printer *)printer_00,(Descriptor *)local_88,options_00,kdoc);
  Options::~Options((Options *)local_88);
  pDVar1 = message_local;
  if ((local_21 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8," * Protobuf type {@code $fullname$}\n */\n");
    sVar2 = Descriptor::full_name((Descriptor *)options_local);
    local_118 = (java *)sVar2._M_len;
    local_110 = sVar2._M_str;
    sVar2._M_str = &options_00->generate_immutable_code;
    sVar2._M_len = (size_t)local_110;
    EscapeJavadoc_abi_cxx11_(&local_108,local_118,sVar2);
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)pDVar1,local_e8,(char (*) [9])"fullname",&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_a8," * Protobuf type `$fullname$`\n */\n");
    local_d8 = Descriptor::full_name((Descriptor *)options_local);
    input._M_str = &options_00->generate_immutable_code;
    input._M_len = (size_t)local_d8._M_str;
    EscapeKdoc_abi_cxx11_(&local_c8,(java *)local_d8._M_len,input);
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)pDVar1,local_a8[0],(char (*) [9])"fullname",&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message,
                            const Options options, const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, message, options, kdoc);
  if (kdoc) {
    printer->Print(
        " * Protobuf type `$fullname$`\n"
        " */\n",
        "fullname", EscapeKdoc(message->full_name()));
  } else {
    printer->Print(
        " * Protobuf type {@code $fullname$}\n"
        " */\n",
        "fullname", EscapeJavadoc(message->full_name()));
  }
}